

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O0

void __thiscall tcmalloc::CentralFreeList::Populate(CentralFreeList *this)

{
  int iVar1;
  LogItem b;
  LogItem c;
  LogItem d;
  SizeMap *this_00;
  PageHeap *pPVar2;
  char *pcVar3;
  long lVar4;
  LogItem a;
  char *nextptr;
  uintptr_t nextaddr;
  int num;
  size_t size;
  char *limit;
  char *ptr;
  void **tail;
  undefined1 auStack_70 [4];
  int i;
  anon_union_8_4_e5b1a622_for_u_ local_68;
  LogItem local_60;
  LogItem local_50;
  LogItem local_40;
  Span *local_30;
  Span *span;
  size_t npages;
  CentralFreeList *this_local;
  SizeMap *local_10;
  
  npages = (size_t)this;
  SpinLock::Unlock(&this->lock_);
  this_00 = Static::sizemap();
  span = (Span *)SizeMap::class_to_pages(this_00,(uint32_t)this->size_class_);
  pPVar2 = Static::pageheap();
  local_30 = PageHeap::NewWithSizeClass(pPVar2,(Length)span,(uint32_t)this->size_class_);
  if (local_30 == (Span *)0x0) {
    LogItem::LogItem(&local_40,"tcmalloc: allocation failed");
    LogItem::LogItem(&local_50,(long)span << 0xd);
    LogItem::LogItem(&local_60);
    LogItem::LogItem((LogItem *)auStack_70);
    a._4_4_ = 0;
    a.tag_ = local_40.tag_;
    b.u_.str = local_50.u_.str;
    b.tag_ = local_50.tag_;
    b._4_4_ = local_50._4_4_;
    c.u_.str = local_60.u_.str;
    c.tag_ = local_60.tag_;
    c._4_4_ = local_60._4_4_;
    d.u_.str = local_68.str;
    d.tag_ = (Tag)auStack_70;
    d._4_4_ = i;
    a.u_.str = local_40.u_.str;
    Log(kLog,
        "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/central_freelist.cc"
        ,0x138,a,b,c,d);
    SpinLock::Lock(&this->lock_);
  }
  else {
    for (tail._4_4_ = 0; (Span *)(long)tail._4_4_ < span; tail._4_4_ = tail._4_4_ + 1) {
      pPVar2 = Static::pageheap();
      PageHeap::SetCachedSizeClass
                (pPVar2,local_30->start + (long)tail._4_4_,(uint32_t)this->size_class_);
    }
    ptr = (char *)&local_30->field_4;
    pcVar3 = (char *)(local_30->start * 0x2000);
    lVar4 = (long)span * 0x2000;
    local_10 = Static::sizemap();
    this_local._4_4_ = (undefined4)this->size_class_;
    iVar1 = local_10->class_to_size_[this->size_class_ & 0xffffffff];
    nextaddr._4_4_ = 0;
    limit = pcVar3;
    while ((!CARRY8((ulong)limit,(long)iVar1) && (limit + iVar1 <= pcVar3 + lVar4))) {
      *(char **)ptr = limit;
      ptr = limit;
      nextaddr._4_4_ = nextaddr._4_4_ + 1;
      limit = limit + iVar1;
    }
    ptr[0] = '\0';
    ptr[1] = '\0';
    ptr[2] = '\0';
    ptr[3] = '\0';
    ptr[4] = '\0';
    ptr[5] = '\0';
    ptr[6] = '\0';
    ptr[7] = '\0';
    *(uint *)&local_30->field_0x28 = *(uint *)&local_30->field_0x28 & 0xffff0000;
    SpinLock::Lock(&this->lock_);
    DLL_Prepend(&this->nonempty_,local_30);
    this->num_spans_ = this->num_spans_ + 1;
    this->counter_ = (long)nextaddr._4_4_ + this->counter_;
  }
  return;
}

Assistant:

void CentralFreeList::Populate() {
  // Release central list lock while operating on pageheap
  lock_.Unlock();
  const size_t npages = Static::sizemap()->class_to_pages(size_class_);

  Span* span = Static::pageheap()->NewWithSizeClass(npages, size_class_);
  if (span == nullptr) {
    Log(kLog, __FILE__, __LINE__,
        "tcmalloc: allocation failed", npages << kPageShift);
    lock_.Lock();
    return;
  }
  ASSERT(span->length == npages);
  // Cache sizeclass info eagerly.  Locking is not necessary.
  // (Instead of being eager, we could just replace any stale info
  // about this span, but that seems to be no better in practice.)
  for (int i = 0; i < npages; i++) {
    Static::pageheap()->SetCachedSizeClass(span->start + i, size_class_);
  }

  // Split the block into pieces and add to the free-list
  // TODO: coloring of objects to avoid cache conflicts?
  void** tail = &span->objects;
  char* ptr = reinterpret_cast<char*>(span->start << kPageShift);
  char* limit = ptr + (npages << kPageShift);
  const size_t size = Static::sizemap()->ByteSizeForClass(size_class_);
  int num = 0;

  // Note, when ptr is close to the top of address space, ptr + size
  // might overflow the top of address space before we're able to
  // detect that it exceeded limit. So we need to be careful. See
  // https://github.com/gperftools/gperftools/issues/1323.
  ASSERT(limit - size >= ptr);
  for (;;) {

#ifndef USE_ADD_OVERFLOW
    auto nextptr = reinterpret_cast<char *>(reinterpret_cast<uintptr_t>(ptr) + size);
    if (nextptr < ptr || nextptr > limit) {
      break;
    }
#else
    // Same as above, just helping compiler a bit to produce better code
    uintptr_t nextaddr;
    if (__builtin_add_overflow(reinterpret_cast<uintptr_t>(ptr), size, &nextaddr)) {
      break;
    }
    char* nextptr = reinterpret_cast<char*>(nextaddr);
    if (nextptr > limit) {
      break;
    }
#endif

    // [ptr, ptr+size) bytes are all valid bytes, so append them
    *tail = ptr;
    tail = reinterpret_cast<void**>(ptr);
    num++;
    ptr = nextptr;
  }
  ASSERT(ptr <= limit);
  ASSERT(ptr > limit - size); // same as ptr + size > limit but avoiding overflow
  *tail = nullptr;
  span->refcount = 0; // No sub-object in use yet

  // Add span to list of non-empty spans
  lock_.Lock();
  tcmalloc::DLL_Prepend(&nonempty_, span);
  ++num_spans_;
  counter_ += num;
}